

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

size_t lua_rawlen(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar2 = index2addr(L,idx);
  switch(pTVar2->tt_ & 0x3f) {
  case 4:
    L_local = (lua_State *)(ulong)(byte)(pTVar2->value_).f[0xb];
    break;
  case 5:
    iVar1 = luaH_getn((Table *)(pTVar2->value_).gc);
    L_local = (lua_State *)(long)iVar1;
    break;
  default:
    L_local = (lua_State *)0x0;
    break;
  case 7:
    L_local = *(lua_State **)((pTVar2->value_).f + 0x18);
    break;
  case 0x14:
    L_local = *(lua_State **)((pTVar2->value_).f + 0x10);
  }
  return (size_t)L_local;
}

Assistant:

LUA_API size_t lua_rawlen (lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttype(o)) {
    case LUA_TSHRSTR: return tsvalue(o)->shrlen;
    case LUA_TLNGSTR: return tsvalue(o)->u.lnglen;
    case LUA_TUSERDATA: return uvalue(o)->len;
    case LUA_TTABLE: return luaH_getn(hvalue(o));
    default: return 0;
  }
}